

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_cipher.cc
# Opt level: O0

EVP_CIPHER * EVP_get_cipherbyname(char *name)

{
  int iVar1;
  EVP_CIPHER *pEVar2;
  ulong local_20;
  size_t i;
  char *name_local;
  
  if (name != (char *)0x0) {
    iVar1 = OPENSSL_strcasecmp(name,"3des");
    i = (size_t)name;
    if (iVar1 == 0) {
      i = (size_t)anon_var_dwarf_6881cb;
    }
    for (local_20 = 0; local_20 < 0x16; local_20 = local_20 + 1) {
      iVar1 = OPENSSL_strcasecmp(kCiphers[local_20].name,(char *)i);
      if (iVar1 == 0) {
        pEVar2 = (EVP_CIPHER *)(*kCiphers[local_20].func)();
        return pEVar2;
      }
    }
  }
  return (EVP_CIPHER *)0x0;
}

Assistant:

const EVP_CIPHER *EVP_get_cipherbyname(const char *name) {
  if (name == NULL) {
    return NULL;
  }

  // This is not a name used by OpenSSL, but tcpdump registers it with
  // |EVP_add_cipher_alias|. Our |EVP_add_cipher_alias| is a no-op, so we
  // support the name here.
  if (OPENSSL_strcasecmp(name, "3des") == 0) {
    name = "des-ede3-cbc";
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kCiphers); i++) {
    if (OPENSSL_strcasecmp(kCiphers[i].name, name) == 0) {
      return kCiphers[i].func();
    }
  }

  return NULL;
}